

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall spirv_cross::CompilerGLSL::variable_is_lut(CompilerGLSL *this,SPIRVariable *var)

{
  Variant *pVVar1;
  ulong uVar2;
  SPIRConstant *pSVar3;
  
  if ((((var->statically_assigned == true) &&
       (uVar2 = (ulong)(var->static_expression).id, uVar2 != 0)) && (var->remapped_variable == true)
      ) && (((uVar2 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                      buffer_size &&
             (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar1[uVar2].type == TypeConstant)) &&
            (pSVar3 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar2),
            pSVar3->is_used_as_lut != false)))) {
    return true;
  }
  return false;
}

Assistant:

bool CompilerGLSL::variable_is_lut(const SPIRVariable &var) const
{
	bool statically_assigned = var.statically_assigned && var.static_expression != ID(0) && var.remapped_variable;

	if (statically_assigned)
	{
		auto *constant = maybe_get<SPIRConstant>(var.static_expression);
		if (constant && constant->is_used_as_lut)
			return true;
	}

	return false;
}